

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qpaintengine_preview.cpp
# Opt level: O2

void __thiscall QPreviewPaintEngine::abort(QPreviewPaintEngine *this)

{
  long lVar1;
  
  lVar1 = *(long *)&this->field_0x18;
  (**(code **)(*(long *)this + 0x18))();
  qDeleteAll<QList<QPicture_const*>>((QList<const_QPicture_*> *)(lVar1 + 0xa0));
  *(undefined4 *)(lVar1 + 200) = 2;
  return;
}

Assistant:

bool QPreviewPaintEngine::abort()
{
    Q_D(QPreviewPaintEngine);
    end();
    qDeleteAll(d->pages);
    d->state = QPrinter::Aborted;

    return true;
}